

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bool local::test_uintwide_t_0008192(void)

{
  bool bVar1;
  ostream *this;
  undefined1 local_80 [7];
  bool result_is_ok;
  test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void>
  test_uintwide_t_n_binary_ops_template_instance;
  size_t count;
  
  test_uintwide_t_n_binary_ops_template_instance.b_boost.
  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<8192U,_8192U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<8192U,_8192U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x100;
  this = std::operator<<((ostream *)&std::cout,"running: test_uintwide_t_0008192");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void>::
  test_uintwide_t_n_binary_ops_template
            ((test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void> *)local_80,0x100);
  bVar1 = test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void>::do_test
                    ((test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void> *)local_80,4)
  ;
  test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void>::
  ~test_uintwide_t_n_binary_ops_template
            ((test_uintwide_t_n_binary_ops_template<8192U,_unsigned_int,_void> *)local_80);
  return bVar1;
}

Assistant:

auto test_uintwide_t_0008192() -> bool
{
  #if !defined(UINTWIDE_T_REDUCE_TEST_DEPTH)
  constexpr auto count = static_cast<std::size_t>(1UL << 8U);
  #else
  constexpr auto count = static_cast<std::size_t>(1UL << 5U);
  #endif

  std::cout << "running: test_uintwide_t_0008192" << std::endl;
  test_uintwide_t_n_binary_ops_template<8192U> test_uintwide_t_n_binary_ops_template_instance(count); // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
  const auto result_is_ok =
    test_uintwide_t_n_binary_ops_template_instance.do_test(test_uintwide_t_n_binary_ops_rounds);
  return result_is_ok;
}